

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.c
# Opt level: O2

ma_result ma_delay_process_pcm_frames
                    (ma_delay *pDelay,void *pFramesOut,void *pFramesIn,ma_uint32 frameCount)

{
  uint uVar1;
  ma_uint32 mVar2;
  float *pfVar3;
  float *pFramesInF32;
  ulong uVar4;
  ma_result mVar5;
  ma_uint32 mVar6;
  ulong uVar7;
  uint uVar8;
  float fVar9;
  
  if (pFramesIn == (void *)0x0 || (pFramesOut == (void *)0x0 || pDelay == (ma_delay *)0x0)) {
    mVar5 = MA_INVALID_ARGS;
  }
  else {
    mVar5 = MA_SUCCESS;
    for (mVar6 = 0; mVar6 != frameCount; mVar6 = mVar6 + 1) {
      uVar1 = (pDelay->config).channels;
      uVar7 = (ulong)uVar1;
      mVar2 = pDelay->cursor;
      for (uVar4 = 0; uVar7 != uVar4; uVar4 = uVar4 + 1) {
        uVar8 = uVar1 * mVar2 + (int)uVar4;
        pfVar3 = pDelay->pBuffer;
        if ((pDelay->config).delayStart == 0) {
          fVar9 = pfVar3[uVar8] * (pDelay->config).decay +
                  *(float *)((long)pFramesIn + uVar4 * 4) * (pDelay->config).dry;
          pfVar3[uVar8] = fVar9;
          *(float *)((long)pFramesOut + uVar4 * 4) = fVar9 * (pDelay->config).wet;
        }
        else {
          *(float *)((long)pFramesOut + uVar4 * 4) = pfVar3[uVar8] * (pDelay->config).wet;
          pfVar3[uVar8] =
               pfVar3[uVar8] * (pDelay->config).decay +
               *(float *)((long)pFramesIn + uVar4 * 4) * (pDelay->config).dry;
        }
      }
      pDelay->cursor = (mVar2 + 1) % pDelay->bufferSizeInFrames;
      pFramesOut = (void *)((long)pFramesOut + uVar7 * 4);
      pFramesIn = (void *)((long)pFramesIn + uVar7 * 4);
    }
  }
  return mVar5;
}

Assistant:

MA_API ma_result ma_delay_process_pcm_frames(ma_delay* pDelay, void* pFramesOut, const void* pFramesIn, ma_uint32 frameCount)
{
    ma_uint32 iFrame;
    ma_uint32 iChannel;
    float* pFramesOutF32 = (float*)pFramesOut;
    const float* pFramesInF32 = (const float*)pFramesIn;

    if (pDelay == NULL || pFramesOut == NULL || pFramesIn == NULL) {
        return MA_INVALID_ARGS;
    }

    for (iFrame = 0; iFrame < frameCount; iFrame += 1) {
        for (iChannel = 0; iChannel < pDelay->config.channels; iChannel += 1) {
            ma_uint32 iBuffer = (pDelay->cursor * pDelay->config.channels) + iChannel;

            if (pDelay->config.delayStart) {
                /* Delayed start. */

                /* Read */
                pFramesOutF32[iChannel] = pDelay->pBuffer[iBuffer] * pDelay->config.wet;

                /* Feedback */
                pDelay->pBuffer[iBuffer] = (pDelay->pBuffer[iBuffer] * pDelay->config.decay) + (pFramesInF32[iChannel] * pDelay->config.dry);
            } else {
                /* Immediate start */

                /* Feedback */
                pDelay->pBuffer[iBuffer] = (pDelay->pBuffer[iBuffer] * pDelay->config.decay) + (pFramesInF32[iChannel] * pDelay->config.dry);

                /* Read */
                pFramesOutF32[iChannel] = pDelay->pBuffer[iBuffer] * pDelay->config.wet;
            }
        }

        pDelay->cursor = (pDelay->cursor + 1) % pDelay->bufferSizeInFrames;

        pFramesOutF32 += pDelay->config.channels;
        pFramesInF32  += pDelay->config.channels;
    }

    return MA_SUCCESS;
}